

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  int iVar1;
  code *UNRECOVERED_JUMPTABLE;
  RtreeNode *pRVar2;
  
  if (0 < iHeight) {
    iVar1 = (int)((iRowid & 0xffffffffU) * 0x51d07eaf >> 0x20);
    for (pRVar2 = pRtree->aHash
                  [(int)iRowid + (((uint)((int)iRowid - iVar1) >> 1) + iVar1 >> 6) * -0x61];
        pRVar2 != (RtreeNode *)0x0; pRVar2 = pRVar2->pNext) {
      if (pRVar2->iNode == iRowid) {
        nodeRelease(pRtree,pRVar2->pParent);
        if (pNode != (RtreeNode *)0x0) {
          pNode->nRef = pNode->nRef + 1;
        }
        pRVar2->pParent = pNode;
        break;
      }
    }
  }
  UNRECOVERED_JUMPTABLE = parentWrite;
  if (iHeight == 0) {
    UNRECOVERED_JUMPTABLE = rowidWrite;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pRtree,iRowid,pNode->iNode,UNRECOVERED_JUMPTABLE);
  return iVar1;
}

Assistant:

static int updateMapping(
  Rtree *pRtree, 
  i64 iRowid, 
  RtreeNode *pNode, 
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}